

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * allocSpace(ReusableSpace *p,void *pBuf,sqlite3_int64 nByte)

{
  ulong uVar1;
  sqlite3_int64 nByte_local;
  void *pBuf_local;
  ReusableSpace *p_local;
  
  nByte_local = (sqlite3_int64)pBuf;
  if (pBuf == (void *)0x0) {
    uVar1 = nByte + 7U & 0xfffffffffffffff8;
    if (p->nFree < (long)uVar1) {
      p->nNeeded = uVar1 + p->nNeeded;
    }
    else {
      p->nFree = p->nFree - uVar1;
      nByte_local = (sqlite3_int64)(p->pSpace + p->nFree);
    }
  }
  return (void *)nByte_local;
}

Assistant:

static void *allocSpace(
  struct ReusableSpace *p,  /* Bulk memory available for allocation */
  void *pBuf,               /* Pointer to a prior allocation */
  sqlite3_int64 nByte       /* Bytes of memory needed */
){
  assert( EIGHT_BYTE_ALIGNMENT(p->pSpace) );
  if( pBuf==0 ){
    nByte = ROUND8(nByte);
    if( nByte <= p->nFree ){
      p->nFree -= nByte;
      pBuf = &p->pSpace[p->nFree];
    }else{
      p->nNeeded += nByte;
    }
  }
  assert( EIGHT_BYTE_ALIGNMENT(pBuf) );
  return pBuf;
}